

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O2

Allocation __thiscall
Diligent::VariableSizeAllocationsManager::Allocate
          (VariableSizeAllocationsManager *this,OffsetType Size,OffsetType Alignment)

{
  ulong uVar1;
  type tVar2;
  iterator __position;
  _Base_ptr p_Var3;
  char (*in_RCX) [9];
  char (*Args_1) [59];
  char (*Args_1_00) [57];
  char (*in_R8) [21];
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  unsigned_long val;
  Allocation AVar6;
  string msg;
  OffsetType Alignment_local;
  iterator local_48;
  type local_40;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
  *local_38;
  
  Alignment_local = Alignment;
  if (Size == 0) {
    FormatString<char[26],char[9]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x66d740,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0xd0);
    std::__cxx11::string::~string((string *)&msg);
  }
  Args_1 = (char (*) [59])(Alignment_local ^ (ulong)(Alignment_local - 1));
  if (Args_1 <= (char (*) [59])(Alignment_local - 1)) {
    FormatString<char[12],unsigned_long,char[21]>
              (&msg,(Diligent *)"Alignment (",(char (*) [12])&Alignment_local,
               (unsigned_long *)") must be power of 2",in_R8);
    Args_1 = (char (*) [59])0xd1;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0xd1);
    std::__cxx11::string::~string((string *)&msg);
  }
  tVar2 = AlignUp<unsigned_long,unsigned_long>(Size,Alignment_local);
  val = 0xffffffffffffffff;
  if (this->m_FreeSize < tVar2) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = (_Base_ptr)0x0;
    p_Var5 = (_Base_ptr)(Alignment_local - this->m_CurrAlignment);
    if (Alignment_local < this->m_CurrAlignment) {
      p_Var5 = p_Var4;
    }
    local_38 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                *)&this->m_FreeBlocksBySize;
    p_Var5 = (_Base_ptr)((long)&p_Var5->_M_color + tVar2);
    msg._M_dataplus._M_p = (pointer)p_Var5;
    __position = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
                 ::lower_bound((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
                                *)local_38,(key_type_conflict *)&msg);
    if ((_Rb_tree_header *)__position._M_node !=
        &(this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header) {
      p_Var4 = __position._M_node[1]._M_parent;
      p_Var3 = p_Var4[1]._M_parent;
      if (p_Var3 < p_Var5) {
        FormatString<char[26],char[56]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Size + AlignmentReserve <= SmallestBlockIt->second.Size",
                   (char (*) [56])Args_1);
        Args_1 = (char (*) [59])0xdf;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xdf);
        std::__cxx11::string::~string((string *)&msg);
        p_Var3 = p_Var4[1]._M_parent;
      }
      if (p_Var3 != *(_Base_ptr *)(__position._M_node + 1)) {
        FormatString<char[26],char[57]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SmallestBlockIt->second.Size == SmallestBlockItIt->first",
                   (char (*) [57])Args_1);
        Args_1 = (char (*) [59])0xe0;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xe0);
        std::__cxx11::string::~string((string *)&msg);
      }
      val = *(unsigned_long *)(p_Var4 + 1);
      local_48._M_node = p_Var4;
      if (val % this->m_CurrAlignment != 0) {
        FormatString<char[26],char[30]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Offset % m_CurrAlignment == 0",(char (*) [30])Args_1);
        Args_1 = (char (*) [59])0xea;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xea);
        std::__cxx11::string::~string((string *)&msg);
      }
      local_40 = AlignUp<unsigned_long,unsigned_long>(val,Alignment_local);
      p_Var4 = (_Base_ptr)((local_40 - val) + tVar2);
      if (p_Var5 < p_Var4) {
        FormatString<char[26],char[40]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"AdjustedSize <= Size + AlignmentReserve",(char (*) [40])Args_1);
        Args_1 = (char (*) [59])0xed;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xed);
        std::__cxx11::string::~string((string *)&msg);
      }
      p_Var5 = local_48._M_node[1]._M_parent;
      if (__position._M_node != local_48._M_node[1]._M_left) {
        FormatString<char[26],char[59]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SmallestBlockItIt == SmallestBlockIt->second.OrderBySizeIt",
                   Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0xf0);
        std::__cxx11::string::~string((string *)&msg);
      }
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
      ::erase_abi_cxx11_(local_38,__position);
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,std::_Select1st<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,std::_Select1st<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                          *)this,local_48);
      if (p_Var5 != p_Var4) {
        AddNewBlock(this,local_40 + tVar2,(long)p_Var5 - (long)p_Var4);
      }
      this->m_FreeSize = this->m_FreeSize - (long)p_Var4;
      uVar1 = this->m_CurrAlignment;
      Args_1_00 = (char (*) [57])(uVar1 - 1);
      if (((ulong)Args_1_00 & tVar2) != 0) {
        if (tVar2 - 1 < (tVar2 ^ tVar2 - 1)) {
          Args_1_00 = (char (*) [57])CONCAT71((int7)(Alignment_local >> 8),Alignment_local <= tVar2)
          ;
          if (uVar1 <= tVar2 || Alignment_local > tVar2) {
            FormatString<char[26],char[44]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"Size >= Alignment && Size < m_CurrAlignment",
                       (char (*) [44])Args_1_00);
            Args_1_00 = (char (*) [57])0xfe;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"Allocate",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                       ,0xfe);
            std::__cxx11::string::~string((string *)&msg);
          }
        }
        else {
          Args_1_00 = (char (*) [57])Alignment_local;
          tVar2 = uVar1;
          if (Alignment_local < uVar1) {
            tVar2 = Alignment_local;
          }
        }
        this->m_CurrAlignment = tVar2;
      }
      if ((this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        FormatString<char[26],char[57]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",
                   Args_1_00);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                   ,0x108);
        std::__cxx11::string::~string((string *)&msg);
      }
      if (this->m_DbgDisableDebugValidation == false) {
        DbgVerifyList(this);
      }
    }
  }
  AVar6.Size = (OffsetType)p_Var4;
  AVar6.UnalignedOffset = val;
  return AVar6;
}

Assistant:

Allocation Allocate(OffsetType Size, OffsetType Alignment)
    {
        VERIFY_EXPR(Size > 0);
        VERIFY(IsPowerOfTwo(Alignment), "Alignment (", Alignment, ") must be power of 2");
        Size = AlignUp(Size, Alignment);
        if (m_FreeSize < Size)
            return Allocation::InvalidAllocation();

        OffsetType AlignmentReserve = (Alignment > m_CurrAlignment) ? Alignment - m_CurrAlignment : 0;
        // Get the first block that is large enough to encompass Size + AlignmentReserve bytes
        // lower_bound() returns an iterator pointing to the first element that
        // is not less (i.e. >= ) than key
        auto SmallestBlockItIt = m_FreeBlocksBySize.lower_bound(Size + AlignmentReserve);
        if (SmallestBlockItIt == m_FreeBlocksBySize.end())
            return Allocation::InvalidAllocation();

        auto SmallestBlockIt = SmallestBlockItIt->second;
        VERIFY_EXPR(Size + AlignmentReserve <= SmallestBlockIt->second.Size);
        VERIFY_EXPR(SmallestBlockIt->second.Size == SmallestBlockItIt->first);

        //     SmallestBlockIt.Offset
        //        |                                  |
        //        |<------SmallestBlockIt.Size------>|
        //        |<------Size------>|<---NewSize--->|
        //        |                  |
        //      Offset              NewOffset
        //
        OffsetType Offset = SmallestBlockIt->first;
        VERIFY_EXPR(Offset % m_CurrAlignment == 0);
        OffsetType AlignedOffset = AlignUp(Offset, Alignment);
        OffsetType AdjustedSize  = Size + (AlignedOffset - Offset);
        VERIFY_EXPR(AdjustedSize <= Size + AlignmentReserve);
        OffsetType NewOffset = Offset + AdjustedSize;
        OffsetType NewSize   = SmallestBlockIt->second.Size - AdjustedSize;
        VERIFY_EXPR(SmallestBlockItIt == SmallestBlockIt->second.OrderBySizeIt);
        m_FreeBlocksBySize.erase(SmallestBlockItIt);
        m_FreeBlocksByOffset.erase(SmallestBlockIt);
        if (NewSize > 0)
        {
            AddNewBlock(NewOffset, NewSize);
        }

        m_FreeSize -= AdjustedSize;

        if ((Size & (m_CurrAlignment - 1)) != 0)
        {
            if (IsPowerOfTwo(Size))
            {
                VERIFY_EXPR(Size >= Alignment && Size < m_CurrAlignment);
                m_CurrAlignment = Size;
            }
            else
            {
                m_CurrAlignment = (std::min)(m_CurrAlignment, Alignment);
            }
        }

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        if (!m_DbgDisableDebugValidation)
            DbgVerifyList();
#endif
        return Allocation{Offset, AdjustedSize};
    }